

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O1

int run_test_tcp_local_connect_timeout(void)

{
  sa_family_t sVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  long lVar4;
  ulong uVar5;
  uv_handle_t *unaff_RBX;
  uv_connect_t *puVar6;
  anon_union_28_2_e90107a3_for_address *paVar7;
  uv_tcp_t *handle;
  uv_loop_t *unaff_R14;
  bool bVar8;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  undefined1 auStack_4b8 [16];
  sockaddr_in6 sStack_4a8;
  uv_handle_t *puStack_488;
  uv_loop_t *puStack_480;
  uv_alloc_cb p_Stack_470;
  uv_read_cb p_Stack_468;
  undefined1 auStack_458 [16];
  undefined8 uStack_448;
  uv_utsname_t uStack_440;
  uv_handle_t *puStack_40;
  long local_30;
  long local_28;
  sockaddr_in local_20;
  
  puStack_40 = (uv_handle_t *)0x1c7324;
  iVar2 = is_supported_system();
  if (iVar2 == 0) {
    puStack_40 = (uv_handle_t *)0x1c74dd;
    run_test_tcp_local_connect_timeout_cold_9();
    return 7;
  }
  puStack_40 = (uv_handle_t *)0x1c7342;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&local_20);
  local_28 = (long)iVar2;
  local_30 = 0;
  if (local_28 == 0) {
    puStack_40 = (uv_handle_t *)0x1c7367;
    puVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1c7376;
    iVar2 = uv_timer_init(puVar3,&timer);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001c74fa;
    puStack_40 = (uv_handle_t *)0x1c73b0;
    iVar2 = uv_timer_start(&timer,timer_cb,1000,0);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001c7509;
    puStack_40 = (uv_handle_t *)0x1c73d5;
    puVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1c73e4;
    iVar2 = uv_tcp_init(puVar3,&conn);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001c7518;
    puStack_40 = (uv_handle_t *)0x1c7423;
    iVar2 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&local_20,connect_local_cb);
    if (iVar2 == -0x65) {
      puStack_40 = (uv_handle_t *)0x1c74e4;
      run_test_tcp_local_connect_timeout_cold_8();
      return 7;
    }
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001c7527;
    puStack_40 = (uv_handle_t *)0x1c7451;
    puVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1c745b;
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001c7536;
    puStack_40 = (uv_handle_t *)0x1c7480;
    unaff_R14 = uv_default_loop();
    unaff_RBX = (uv_handle_t *)0x0;
    puStack_40 = (uv_handle_t *)0x1c7496;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    puStack_40 = (uv_handle_t *)0x1c74a0;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    local_28 = 0;
    puStack_40 = (uv_handle_t *)0x1c74ae;
    puVar3 = uv_default_loop();
    puStack_40 = (uv_handle_t *)0x1c74b6;
    iVar2 = uv_loop_close(puVar3);
    local_30 = (long)iVar2;
    if (local_28 == local_30) {
      puStack_40 = (uv_handle_t *)0x1c74ce;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_40 = (uv_handle_t *)0x1c74fa;
    run_test_tcp_local_connect_timeout_cold_1();
LAB_001c74fa:
    puStack_40 = (uv_handle_t *)0x1c7509;
    run_test_tcp_local_connect_timeout_cold_2();
LAB_001c7509:
    puStack_40 = (uv_handle_t *)0x1c7518;
    run_test_tcp_local_connect_timeout_cold_3();
LAB_001c7518:
    puStack_40 = (uv_handle_t *)0x1c7527;
    run_test_tcp_local_connect_timeout_cold_4();
LAB_001c7527:
    puStack_40 = (uv_handle_t *)0x1c7536;
    run_test_tcp_local_connect_timeout_cold_5();
LAB_001c7536:
    puStack_40 = (uv_handle_t *)0x1c7545;
    run_test_tcp_local_connect_timeout_cold_6();
  }
  puStack_40 = (uv_handle_t *)is_supported_system;
  run_test_tcp_local_connect_timeout_cold_7();
  p_Stack_468 = (uv_read_cb)0x1c7566;
  puStack_40 = unaff_RBX;
  iVar2 = uv_os_uname(&uStack_440);
  auStack_458._0_8_ = SEXT48(iVar2);
  uStack_448 = (uv__queue *)0x0;
  if ((uv_shutdown_t *)auStack_458._0_8_ == (uv_shutdown_t *)0x0) {
    if (CONCAT35(uStack_440.sysname._8_3_,uStack_440.sysname._3_5_) == 0x544e5f73776f64 &&
        CONCAT53(uStack_440.sysname._3_5_,uStack_440.sysname._0_3_) == 0x5f73776f646e6957) {
      p_Stack_468 = (uv_read_cb)0x1c75e0;
      iVar2 = sscanf(uStack_440.release,"%d.%d.%d",auStack_458,auStack_458 + 4,auStack_458 + 8);
      if (iVar2 != 3) {
        return 0;
      }
      lVar4 = 0;
      do {
        if (*(int *)((long)&DAT_00207ad0 + lVar4) < *(int *)(auStack_458 + lVar4)) {
          return 1;
        }
        if (*(int *)(auStack_458 + lVar4) < *(int *)((long)&DAT_00207ad0 + lVar4)) {
          return 0;
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0xc);
    }
    return 1;
  }
  puVar6 = (uv_connect_t *)auStack_458;
  iVar2 = (int)&uStack_448;
  p_Stack_468 = connect_local_cb;
  is_supported_system_cold_1();
  if (puVar6 == &connect_req) {
    p_Stack_468 = (uv_read_cb)(long)iVar2;
    p_Stack_470 = (uv_alloc_cb)0xffffffffffffff83;
    if (p_Stack_468 != (uv_read_cb)0xffffffffffffff83) {
      connect_cb_called = connect_cb_called + 1;
      return iVar2;
    }
  }
  else {
    puStack_480 = (uv_loop_t *)0x1c7657;
    connect_local_cb_cold_1();
  }
  puStack_480 = (uv_loop_t *)run_test_tcp6_local_connect_timeout;
  connect_local_cb_cold_2();
  puStack_488 = unaff_RBX;
  puStack_480 = unaff_R14;
  iVar2 = is_supported_system();
  if (iVar2 == 0) {
    run_test_tcp6_local_connect_timeout_cold_10();
    return 7;
  }
  iVar2 = uv_interface_addresses((uv_interface_address_t **)&sStack_4a8,(int *)auStack_4b8);
  if (iVar2 != 0) {
LAB_001c788e:
    run_test_tcp6_local_connect_timeout_cold_1();
    return 7;
  }
  if ((long)(int)auStack_4b8._0_4_ < 1) {
    uv_free_interface_addresses((uv_interface_address_t *)sStack_4a8._0_8_,auStack_4b8._0_4_);
    goto LAB_001c788e;
  }
  paVar7 = (anon_union_28_2_e90107a3_for_address *)(sStack_4a8._0_8_ + 0x14);
  uVar5 = 1;
  do {
    sVar1 = (paVar7->address4).sin_family;
    if (sVar1 == 10) break;
    paVar7 = (anon_union_28_2_e90107a3_for_address *)((long)paVar7 + 0x60);
    bVar8 = uVar5 < (ulong)(long)(int)auStack_4b8._0_4_;
    uVar5 = uVar5 + 1;
  } while (bVar8);
  uv_free_interface_addresses((uv_interface_address_t *)sStack_4a8._0_8_,auStack_4b8._0_4_);
  if (sVar1 != 10) goto LAB_001c788e;
  iVar2 = uv_ip6_addr("::1",9999,&sStack_4a8);
  auStack_4b8._0_8_ = SEXT48(iVar2);
  auStack_4b8._8_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_4b8._0_8_ == (uv_loop_t *)0x0) {
    puVar3 = uv_default_loop();
    iVar2 = uv_timer_init(puVar3,&timer);
    auStack_4b8._0_8_ = SEXT48(iVar2);
    auStack_4b8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_4b8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c78b8;
    iVar2 = uv_timer_start(&timer,timer_cb,1000,0);
    auStack_4b8._0_8_ = SEXT48(iVar2);
    auStack_4b8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_4b8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c78c7;
    puVar3 = uv_default_loop();
    iVar2 = uv_tcp_init(puVar3,&conn);
    auStack_4b8._0_8_ = SEXT48(iVar2);
    auStack_4b8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_4b8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c78d6;
    iVar2 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&sStack_4a8,connect_local_cb);
    if (iVar2 == -0x65) {
      run_test_tcp6_local_connect_timeout_cold_9();
      return 7;
    }
    auStack_4b8._0_8_ = SEXT48(iVar2);
    auStack_4b8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_4b8._0_8_ != (uv_loop_t *)0x0) goto LAB_001c78e5;
    puVar3 = uv_default_loop();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_4b8._0_8_ = SEXT48(iVar2);
    auStack_4b8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_4b8._0_8_ == (uv_loop_t *)0x0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_4b8._0_8_ = (uv_loop_t *)0x0;
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      auStack_4b8._8_8_ = SEXT48(iVar2);
      if (auStack_4b8._0_8_ == auStack_4b8._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c7903;
    }
  }
  else {
    run_test_tcp6_local_connect_timeout_cold_2();
LAB_001c78b8:
    run_test_tcp6_local_connect_timeout_cold_3();
LAB_001c78c7:
    run_test_tcp6_local_connect_timeout_cold_4();
LAB_001c78d6:
    run_test_tcp6_local_connect_timeout_cold_5();
LAB_001c78e5:
    run_test_tcp6_local_connect_timeout_cold_6();
  }
  run_test_tcp6_local_connect_timeout_cold_7();
LAB_001c7903:
  handle = (uv_tcp_t *)auStack_4b8;
  run_test_tcp6_local_connect_timeout_cold_8();
  if (handle == (uv_tcp_t *)&timer || handle == &conn) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x399b,handle == &conn);
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing((uv_handle_t *)handle);
  if (iVar2 == 0) {
    uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_local_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  if (!is_supported_system()) {
    RETURN_SKIP("Unsupported system");
  }
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  /* Give it 1s to timeout. */
  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_local_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}